

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

void d68040_cinv(void)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = (ulong)g_cpu_ir;
  if (((byte)g_cpu_type & 0x10) == 0) {
    if ((~g_cpu_ir & 0xf000) == 0) {
      pcVar2 = "dc.w    $%04x; opcode 1111";
    }
    else {
      pcVar2 = "dc.w $%04x; ILLEGAL";
    }
LAB_003fcd1d:
    sprintf(g_dasm_str,pcVar2,uVar1);
    return;
  }
  switch(g_cpu_ir >> 3 & 3) {
  case 0:
    builtin_strncpy(g_dasm_str + 0x10," scope); (4)",0xd);
    builtin_strncpy(g_dasm_str,"cinv    (illegal",0x10);
    return;
  case 1:
    pcVar2 = "cinvl   %d, (A%d); (4)";
    break;
  case 2:
    pcVar2 = "cinvp   %d, (A%d); (4)";
    break;
  case 3:
    uVar1 = (ulong)(g_cpu_ir >> 6 & 3);
    pcVar2 = "cinva   %d; (4)";
    goto LAB_003fcd1d;
  }
  sprintf(g_dasm_str,pcVar2,(ulong)(g_cpu_ir >> 6 & 3),(ulong)(g_cpu_ir & 7));
  return;
}

Assistant:

static void d68040_cinv(void)
{
	LIMIT_CPU_TYPES(M68040_PLUS);
	switch((g_cpu_ir>>3)&3)
	{
		case 0:
			sprintf(g_dasm_str, "cinv    (illegal scope); (4)");
			break;
		case 1:
			sprintf(g_dasm_str, "cinvl   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 2:
			sprintf(g_dasm_str, "cinvp   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 3:
			sprintf(g_dasm_str, "cinva   %d; (4)", (g_cpu_ir>>6)&3);
			break;
	}
}